

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

uint64_t float128_to_uint64_m68k(float128 a,float_status *status)

{
  float128 a_00;
  float128 a_01;
  float128 a_02;
  float128 a_03;
  int iVar1;
  uint64_t local_48;
  uint64_t aSig1;
  uint64_t aSig0;
  int local_30;
  int shiftCount;
  int aExp;
  flag aSign;
  float_status *status_local;
  float128 a_local;
  
  a_local.low = a.high;
  status_local = (float_status *)a.low;
  _aExp = status;
  aSig1 = extractFloat128Frac0(a);
  a_00.high = a_local.low;
  a_00.low = (uint64_t)status_local;
  local_48 = extractFloat128Frac1(a_00);
  a_01.high = a_local.low;
  a_01.low = (uint64_t)status_local;
  local_30 = extractFloat128Exp(a_01);
  a_02.high = a_local.low;
  a_02.low = (uint64_t)status_local;
  shiftCount._3_1_ = extractFloat128Sign(a_02);
  if ((shiftCount._3_1_ == '\0') || (local_30 < 0x3fff)) {
    if (local_30 != 0) {
      aSig1 = aSig1 | 0x1000000000000;
    }
    aSig0._4_4_ = 0x402f - local_30;
    if (aSig0._4_4_ < 1) {
      if (0x403e < local_30) {
        float_raise_m68k('\x01',_aExp);
        return 0xffffffffffffffff;
      }
      shortShift128Left(aSig1,local_48,-aSig0._4_4_,&aSig1,&local_48);
    }
    else {
      shift64ExtraRightJamming(aSig1,local_48,aSig0._4_4_,&aSig1,&local_48);
    }
    a_local.high = roundAndPackUint64(shiftCount._3_1_,aSig1,local_48,_aExp);
  }
  else {
    float_raise_m68k('\x01',_aExp);
    a_03.high = a_local.low;
    a_03.low = (uint64_t)status_local;
    iVar1 = float128_is_any_nan(a_03);
    if (iVar1 == 0) {
      a_local.high = 0;
    }
    else {
      a_local.high = 0xffffffffffffffff;
    }
  }
  return a_local.high;
}

Assistant:

uint64_t float128_to_uint64(float128 a, float_status *status)
{
    flag aSign;
    int aExp;
    int shiftCount;
    uint64_t aSig0, aSig1;

    aSig0 = extractFloat128Frac0(a);
    aSig1 = extractFloat128Frac1(a);
    aExp = extractFloat128Exp(a);
    aSign = extractFloat128Sign(a);
    if (aSign && (aExp > 0x3FFE)) {
        float_raise(float_flag_invalid, status);
        if (float128_is_any_nan(a)) {
            return UINT64_MAX;
        } else {
            return 0;
        }
    }
    if (aExp) {
        aSig0 |= UINT64_C(0x0001000000000000);
    }
    shiftCount = 0x402F - aExp;
    if (shiftCount <= 0) {
        if (0x403E < aExp) {
            float_raise(float_flag_invalid, status);
            return UINT64_MAX;
        }
        shortShift128Left(aSig0, aSig1, -shiftCount, &aSig0, &aSig1);
    } else {
        shift64ExtraRightJamming(aSig0, aSig1, shiftCount, &aSig0, &aSig1);
    }
    return roundAndPackUint64(aSign, aSig0, aSig1, status);
}